

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

void __thiscall
EOPlus::Parser_Token_Server_Base::Parser_Token_Server_Base(Parser_Token_Server_Base *this)

{
  variant local_50;
  Parser_Token_Server_Base *local_10;
  Parser_Token_Server_Base *this_local;
  
  this->_vptr_Parser_Token_Server_Base = (_func_int **)&PTR___cxa_pure_virtual_002c56f8;
  local_10 = this;
  std::stack<EOPlus::Token,std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>>::
  stack<std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>,void>
            ((stack<EOPlus::Token,std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>> *)
             &this->token_buffer);
  this->line = 1;
  util::variant::variant(&local_50);
  Token::Token(&this->reject_token,Invalid,&local_50);
  util::variant::~variant(&local_50);
  this->reject_line = 1;
  return;
}

Assistant:

Parser_Token_Server_Base::Parser_Token_Server_Base()
		: line(1)
		, reject_line(1)
	{ }